

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter_impl.h
# Opt level: O0

void __thiscall spdlog::details::z_formatter::format(z_formatter *this,log_msg *msg,tm *tm_time)

{
  int m;
  int h;
  char sign;
  bool is_negative;
  int total_minutes;
  tm *tm_time_local;
  log_msg *msg_local;
  z_formatter *this_local;
  
  h = os::utc_minutes_offset(tm_time);
  if (h < 0) {
    h = -h;
    m._2_1_ = '-';
  }
  else {
    m._2_1_ = '+';
  }
  fmt::BasicWriter<char>::operator<<(&(msg->formatted).super_BasicWriter<char>,m._2_1_);
  pad_n_join(&msg->formatted,h / 0x3c,h % 0x3c,':');
  return;
}

Assistant:

void format(details::log_msg &msg, const std::tm &tm_time) override
    {
#ifdef _WIN32
        int total_minutes = get_cached_offset(msg, tm_time);
#else
        // No need to chache under gcc,
        // it is very fast (already stored in tm.tm_gmtoff)
        int total_minutes = os::utc_minutes_offset(tm_time);
#endif
        bool is_negative = total_minutes < 0;
        char sign;
        if (is_negative)
        {
            total_minutes = -total_minutes;
            sign = '-';
        }
        else
        {
            sign = '+';
        }

        int h = total_minutes / 60;
        int m = total_minutes % 60;
        msg.formatted << sign;
        pad_n_join(msg.formatted, h, m, ':');
    }